

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  Scene *pSVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  AABBNodeMB4D *node1;
  ulong uVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  undefined4 uVar44;
  ulong unaff_RBX;
  size_t mask;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  NodeRef *pNVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  size_t sVar58;
  uint uVar59;
  ulong uVar60;
  bool bVar61;
  bool bVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [16];
  UVIdentity<4> mapUV;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 *local_a78;
  ulong local_a70;
  ulong local_a68;
  NodeRef *local_a60;
  RTCFilterFunctionNArguments args;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  UVIdentity<4> *local_8e8;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar116._4_4_ = uVar2;
  auVar116._0_4_ = uVar2;
  auVar116._8_4_ = uVar2;
  auVar116._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar27 = fVar4 * 0.99999964;
  fVar28 = fVar5 * 0.99999964;
  fVar29 = fVar6 * 0.99999964;
  fVar4 = fVar4 * 1.0000004;
  fVar5 = fVar5 * 1.0000004;
  fVar6 = fVar6 * 1.0000004;
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar53 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar55 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar7 = (tray->tnear).field_0.i[k];
  iVar8 = (tray->tfar).field_0.i[k];
  auVar63._4_4_ = iVar8;
  auVar63._0_4_ = iVar8;
  auVar63._8_4_ = iVar8;
  auVar63._12_4_ = iVar8;
  local_a78 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  pNVar50 = stack + 1;
  do {
    local_a60 = pNVar50;
    if (local_a60 == stack) break;
    pNVar50 = local_a60 + -1;
    sVar58 = local_a60[-1].ptr;
    do {
      if ((sVar58 & 8) == 0) {
        uVar38 = sVar58 & 0xfffffffffffffff0;
        uVar44 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar64._4_4_ = uVar44;
        auVar64._0_4_ = uVar44;
        auVar64._8_4_ = uVar44;
        auVar64._12_4_ = uVar44;
        auVar65 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar42),auVar64,
                                  *(undefined1 (*) [16])(uVar38 + 0x20 + uVar42));
        auVar65 = vsubps_avx(auVar65,auVar116);
        auVar72._0_4_ = auVar65._0_4_ * fVar27;
        auVar72._4_4_ = auVar65._4_4_ * fVar27;
        auVar72._8_4_ = auVar65._8_4_ * fVar27;
        auVar72._12_4_ = auVar65._12_4_ * fVar27;
        auVar65._4_4_ = iVar7;
        auVar65._0_4_ = iVar7;
        auVar65._8_4_ = iVar7;
        auVar65._12_4_ = iVar7;
        auVar65 = vmaxps_avx(auVar65,auVar72);
        auVar72 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar53),auVar64,
                                  *(undefined1 (*) [16])(uVar38 + 0x20 + uVar53));
        auVar31._4_4_ = uVar2;
        auVar31._0_4_ = uVar2;
        auVar31._8_4_ = uVar2;
        auVar31._12_4_ = uVar2;
        auVar72 = vsubps_avx(auVar72,auVar31);
        auVar78._0_4_ = auVar72._0_4_ * fVar28;
        auVar78._4_4_ = auVar72._4_4_ * fVar28;
        auVar78._8_4_ = auVar72._8_4_ * fVar28;
        auVar78._12_4_ = auVar72._12_4_ * fVar28;
        auVar72 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar55),auVar64,
                                  *(undefined1 (*) [16])(uVar38 + 0x20 + uVar55));
        auVar12._4_4_ = uVar3;
        auVar12._0_4_ = uVar3;
        auVar12._8_4_ = uVar3;
        auVar12._12_4_ = uVar3;
        auVar72 = vsubps_avx(auVar72,auVar12);
        auVar84._0_4_ = auVar72._0_4_ * fVar29;
        auVar84._4_4_ = auVar72._4_4_ * fVar29;
        auVar84._8_4_ = auVar72._8_4_ * fVar29;
        auVar84._12_4_ = auVar72._12_4_ * fVar29;
        auVar72 = vmaxps_avx(auVar78,auVar84);
        auVar65 = vmaxps_avx(auVar65,auVar72);
        auVar72 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + (uVar42 ^ 0x10)),auVar64,
                                  *(undefined1 (*) [16])(uVar38 + 0x20 + (uVar42 ^ 0x10)));
        auVar72 = vsubps_avx(auVar72,auVar116);
        auVar79._0_4_ = auVar72._0_4_ * fVar4;
        auVar79._4_4_ = auVar72._4_4_ * fVar4;
        auVar79._8_4_ = auVar72._8_4_ * fVar4;
        auVar79._12_4_ = auVar72._12_4_ * fVar4;
        auVar72 = vminps_avx(auVar63,auVar79);
        auVar78 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + (uVar53 ^ 0x10)),auVar64,
                                  *(undefined1 (*) [16])(uVar38 + 0x20 + (uVar53 ^ 0x10)));
        auVar78 = vsubps_avx(auVar78,auVar31);
        auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + (uVar55 ^ 0x10)),auVar64,
                                  *(undefined1 (*) [16])(uVar38 + 0x20 + (uVar55 ^ 0x10)));
        auVar85._0_4_ = auVar78._0_4_ * fVar5;
        auVar85._4_4_ = auVar78._4_4_ * fVar5;
        auVar85._8_4_ = auVar78._8_4_ * fVar5;
        auVar85._12_4_ = auVar78._12_4_ * fVar5;
        auVar78 = vsubps_avx(auVar31,auVar12);
        auVar89._0_4_ = auVar78._0_4_ * fVar6;
        auVar89._4_4_ = auVar78._4_4_ * fVar6;
        auVar89._8_4_ = auVar78._8_4_ * fVar6;
        auVar89._12_4_ = auVar78._12_4_ * fVar6;
        auVar78 = vminps_avx(auVar85,auVar89);
        auVar72 = vminps_avx(auVar72,auVar78);
        if (((uint)sVar58 & 7) == 6) {
          auVar72 = vcmpps_avx(auVar65,auVar72,2);
          auVar65 = vcmpps_avx(*(undefined1 (*) [16])(uVar38 + 0xe0),auVar64,2);
          auVar78 = vcmpps_avx(auVar64,*(undefined1 (*) [16])(uVar38 + 0xf0),1);
          auVar65 = vandps_avx(auVar65,auVar78);
          auVar65 = vandps_avx(auVar65,auVar72);
        }
        else {
          auVar65 = vcmpps_avx(auVar65,auVar72,2);
        }
        auVar65 = vpslld_avx(auVar65,0x1f);
        uVar44 = vmovmskps_avx(auVar65);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar44);
      }
      if ((sVar58 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar59 = 4;
        }
        else {
          uVar57 = sVar58 & 0xfffffffffffffff0;
          lVar39 = 0;
          for (uVar38 = unaff_RBX; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
            lVar39 = lVar39 + 1;
          }
          uVar59 = 0;
          for (uVar38 = unaff_RBX - 1 & unaff_RBX; sVar58 = *(size_t *)(uVar57 + lVar39 * 8),
              uVar38 != 0; uVar38 = uVar38 - 1 & uVar38) {
            pNVar50->ptr = sVar58;
            pNVar50 = pNVar50 + 1;
            lVar39 = 0;
            for (uVar46 = uVar38; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
              lVar39 = lVar39 + 1;
            }
          }
        }
      }
      else {
        uVar59 = 6;
      }
    } while (uVar59 == 0);
    if (uVar59 == 6) {
      uVar59 = 0;
      local_a70 = (ulong)((uint)sVar58 & 0xf) - 8;
      bVar61 = local_a70 != 0;
      if (bVar61) {
        uVar38 = sVar58 & 0xfffffffffffffff0;
        local_a68 = 0;
        do {
          lVar43 = local_a68 * 0x50;
          pSVar13 = context->scene;
          pGVar14 = (pSVar13->geometries).items[*(uint *)(uVar38 + 0x30 + lVar43)].ptr;
          fVar9 = (pGVar14->time_range).lower;
          fVar9 = pGVar14->fnumTimeSegments *
                  ((*(float *)(ray + k * 4 + 0x70) - fVar9) / ((pGVar14->time_range).upper - fVar9))
          ;
          auVar65 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
          auVar65 = vminss_avx(auVar65,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
          auVar91 = vmaxss_avx(ZEXT816(0),auVar65);
          lVar40 = (long)(int)auVar91._0_4_ * 0x38;
          uVar60 = (ulong)*(uint *)(uVar38 + 4 + lVar43);
          lVar39 = *(long *)(*(long *)&pGVar14[2].numPrimitives + lVar40);
          lVar40 = *(long *)(*(long *)&pGVar14[2].numPrimitives + 0x38 + lVar40);
          auVar65 = *(undefined1 (*) [16])(lVar39 + (ulong)*(uint *)(uVar38 + lVar43) * 4);
          uVar46 = (ulong)*(uint *)(uVar38 + 0x10 + lVar43);
          auVar72 = *(undefined1 (*) [16])(lVar39 + uVar46 * 4);
          uVar41 = (ulong)*(uint *)(uVar38 + 0x20 + lVar43);
          auVar68 = *(undefined1 (*) [16])(lVar39 + uVar41 * 4);
          auVar78 = *(undefined1 (*) [16])(lVar39 + uVar60 * 4);
          uVar47 = (ulong)*(uint *)(uVar38 + 0x14 + lVar43);
          auVar31 = *(undefined1 (*) [16])(lVar39 + uVar47 * 4);
          uVar48 = (ulong)*(uint *)(uVar38 + 0x24 + lVar43);
          auVar69 = *(undefined1 (*) [16])(lVar39 + uVar48 * 4);
          uVar49 = (ulong)*(uint *)(uVar38 + 8 + lVar43);
          auVar12 = *(undefined1 (*) [16])(lVar39 + uVar49 * 4);
          uVar54 = (ulong)*(uint *)(uVar38 + 0x18 + lVar43);
          auVar64 = *(undefined1 (*) [16])(lVar39 + uVar54 * 4);
          uVar51 = (ulong)*(uint *)(uVar38 + 0x28 + lVar43);
          auVar79 = *(undefined1 (*) [16])(lVar39 + uVar51 * 4);
          uVar57 = (ulong)*(uint *)(uVar38 + 0xc + lVar43);
          auVar84 = *(undefined1 (*) [16])(lVar39 + uVar57 * 4);
          uVar56 = (ulong)*(uint *)(uVar38 + 0x1c + lVar43);
          auVar85 = *(undefined1 (*) [16])(lVar39 + uVar56 * 4);
          uVar52 = (ulong)*(uint *)(uVar38 + 0x2c + lVar43);
          auVar89 = *(undefined1 (*) [16])(lVar39 + uVar52 * 4);
          auVar98 = *(undefined1 (*) [16])(lVar40 + (ulong)*(uint *)(uVar38 + lVar43) * 4);
          auVar101 = *(undefined1 (*) [16])(lVar40 + uVar46 * 4);
          fVar9 = fVar9 - auVar91._0_4_;
          auVar91 = vunpcklps_avx(auVar65,auVar12);
          auVar12 = vunpckhps_avx(auVar65,auVar12);
          auVar73 = vunpcklps_avx(auVar78,auVar84);
          auVar78 = vunpckhps_avx(auVar78,auVar84);
          auVar65 = *(undefined1 (*) [16])(lVar40 + uVar60 * 4);
          auVar66 = vunpcklps_avx(auVar12,auVar78);
          auVar67 = vunpcklps_avx(auVar91,auVar73);
          auVar12 = vunpckhps_avx(auVar91,auVar73);
          auVar84 = vunpcklps_avx(auVar72,auVar64);
          auVar78 = vunpckhps_avx(auVar72,auVar64);
          auVar64 = vunpcklps_avx(auVar31,auVar85);
          auVar31 = vunpckhps_avx(auVar31,auVar85);
          auVar72 = *(undefined1 (*) [16])(lVar40 + uVar49 * 4);
          auVar85 = vunpcklps_avx(auVar78,auVar31);
          auVar91 = vunpcklps_avx(auVar84,auVar64);
          auVar31 = vunpckhps_avx(auVar84,auVar64);
          auVar84 = vunpcklps_avx(auVar68,auVar79);
          auVar64 = vunpckhps_avx(auVar68,auVar79);
          auVar73 = vunpcklps_avx(auVar69,auVar89);
          auVar79 = vunpckhps_avx(auVar69,auVar89);
          auVar78 = *(undefined1 (*) [16])(lVar40 + uVar57 * 4);
          auVar89 = vunpcklps_avx(auVar64,auVar79);
          auVar68 = vunpcklps_avx(auVar84,auVar73);
          auVar64 = vunpckhps_avx(auVar84,auVar73);
          auVar79 = vunpcklps_avx(auVar98,auVar72);
          auVar72 = vunpckhps_avx(auVar98,auVar72);
          auVar84 = vunpcklps_avx(auVar65,auVar78);
          auVar78 = vunpckhps_avx(auVar65,auVar78);
          auVar65 = *(undefined1 (*) [16])(lVar40 + uVar54 * 4);
          auVar98 = vunpcklps_avx(auVar72,auVar78);
          auVar73 = vunpcklps_avx(auVar79,auVar84);
          auVar78 = vunpckhps_avx(auVar79,auVar84);
          auVar84 = vunpcklps_avx(auVar101,auVar65);
          auVar79 = vunpckhps_avx(auVar101,auVar65);
          auVar65 = *(undefined1 (*) [16])(lVar40 + uVar47 * 4);
          auVar72 = *(undefined1 (*) [16])(lVar40 + uVar56 * 4);
          auVar101 = vunpcklps_avx(auVar65,auVar72);
          auVar65 = vunpckhps_avx(auVar65,auVar72);
          auVar69 = vunpcklps_avx(auVar79,auVar65);
          auVar74 = vunpcklps_avx(auVar84,auVar101);
          auVar79 = vunpckhps_avx(auVar84,auVar101);
          auVar65 = *(undefined1 (*) [16])(lVar40 + uVar41 * 4);
          auVar72 = *(undefined1 (*) [16])(lVar40 + uVar51 * 4);
          auVar101 = vunpcklps_avx(auVar65,auVar72);
          auVar84 = vunpckhps_avx(auVar65,auVar72);
          auVar65 = *(undefined1 (*) [16])(lVar40 + uVar48 * 4);
          auVar72 = *(undefined1 (*) [16])(lVar40 + uVar52 * 4);
          auVar75 = vunpcklps_avx(auVar65,auVar72);
          auVar65 = vunpckhps_avx(auVar65,auVar72);
          auVar72 = vunpcklps_avx(auVar84,auVar65);
          auVar84 = vunpcklps_avx(auVar101,auVar75);
          auVar65 = vunpckhps_avx(auVar101,auVar75);
          fVar30 = 1.0 - fVar9;
          auVar123._4_4_ = fVar30;
          auVar123._0_4_ = fVar30;
          auVar123._8_4_ = fVar30;
          auVar123._12_4_ = fVar30;
          auVar101._0_4_ = fVar9 * auVar73._0_4_;
          auVar101._4_4_ = fVar9 * auVar73._4_4_;
          auVar101._8_4_ = fVar9 * auVar73._8_4_;
          auVar101._12_4_ = fVar9 * auVar73._12_4_;
          auVar101 = vfmadd231ps_fma(auVar101,auVar123,auVar67);
          auVar117._0_4_ = fVar9 * auVar78._0_4_;
          auVar117._4_4_ = fVar9 * auVar78._4_4_;
          auVar117._8_4_ = fVar9 * auVar78._8_4_;
          auVar117._12_4_ = fVar9 * auVar78._12_4_;
          auVar78 = vfmadd231ps_fma(auVar117,auVar123,auVar12);
          auVar108._0_4_ = fVar9 * auVar98._0_4_;
          auVar108._4_4_ = fVar9 * auVar98._4_4_;
          auVar108._8_4_ = fVar9 * auVar98._8_4_;
          auVar108._12_4_ = fVar9 * auVar98._12_4_;
          auVar98 = vfmadd231ps_fma(auVar108,auVar123,auVar66);
          auVar97._0_4_ = fVar9 * auVar74._0_4_;
          auVar97._4_4_ = fVar9 * auVar74._4_4_;
          auVar97._8_4_ = fVar9 * auVar74._8_4_;
          auVar97._12_4_ = fVar9 * auVar74._12_4_;
          auVar91 = vfmadd231ps_fma(auVar97,auVar123,auVar91);
          auVar90._0_4_ = fVar9 * auVar79._0_4_;
          auVar90._4_4_ = fVar9 * auVar79._4_4_;
          auVar90._8_4_ = fVar9 * auVar79._8_4_;
          auVar90._12_4_ = fVar9 * auVar79._12_4_;
          auVar79 = vfmadd231ps_fma(auVar90,auVar123,auVar31);
          puVar1 = (undefined8 *)(uVar38 + 0x30 + lVar43);
          local_928 = *puVar1;
          uStack_920 = puVar1[1];
          puVar1 = (undefined8 *)(uVar38 + 0x40 + lVar43);
          auVar73._0_4_ = fVar9 * auVar69._0_4_;
          auVar73._4_4_ = fVar9 * auVar69._4_4_;
          auVar73._8_4_ = fVar9 * auVar69._8_4_;
          auVar73._12_4_ = fVar9 * auVar69._12_4_;
          auVar85 = vfmadd231ps_fma(auVar73,auVar123,auVar85);
          auVar80._0_4_ = fVar9 * auVar84._0_4_;
          auVar80._4_4_ = fVar9 * auVar84._4_4_;
          auVar80._8_4_ = fVar9 * auVar84._8_4_;
          auVar80._12_4_ = fVar9 * auVar84._12_4_;
          auVar86._0_4_ = fVar9 * auVar65._0_4_;
          auVar86._4_4_ = fVar9 * auVar65._4_4_;
          auVar86._8_4_ = fVar9 * auVar65._8_4_;
          auVar86._12_4_ = fVar9 * auVar65._12_4_;
          auVar121._0_4_ = fVar9 * auVar72._0_4_;
          auVar121._4_4_ = fVar9 * auVar72._4_4_;
          auVar121._8_4_ = fVar9 * auVar72._8_4_;
          auVar121._12_4_ = fVar9 * auVar72._12_4_;
          auVar84 = vfmadd231ps_fma(auVar80,auVar123,auVar68);
          auVar73 = vfmadd231ps_fma(auVar86,auVar123,auVar64);
          auVar89 = vfmadd231ps_fma(auVar121,auVar123,auVar89);
          local_938 = *puVar1;
          uStack_930 = puVar1[1];
          local_8e8 = &mapUV;
          uVar44 = *(undefined4 *)(ray + k * 4);
          auVar66._4_4_ = uVar44;
          auVar66._0_4_ = uVar44;
          auVar66._8_4_ = uVar44;
          auVar66._12_4_ = uVar44;
          uVar44 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar124._4_4_ = uVar44;
          auVar124._0_4_ = uVar44;
          auVar124._8_4_ = uVar44;
          auVar124._12_4_ = uVar44;
          uVar44 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar126._4_4_ = uVar44;
          auVar126._0_4_ = uVar44;
          auVar126._8_4_ = uVar44;
          auVar126._12_4_ = uVar44;
          auVar31 = vsubps_avx(auVar101,auVar66);
          auVar12 = vsubps_avx(auVar78,auVar124);
          auVar65 = vsubps_avx(auVar98,auVar126);
          auVar72 = vsubps_avx(auVar91,auVar66);
          auVar78 = vsubps_avx(auVar79,auVar124);
          auVar64 = vsubps_avx(auVar85,auVar126);
          auVar79 = vsubps_avx(auVar84,auVar66);
          auVar84 = vsubps_avx(auVar73,auVar124);
          auVar85 = vsubps_avx(auVar89,auVar126);
          auVar89 = vsubps_avx(auVar79,auVar31);
          auVar98 = vsubps_avx(auVar84,auVar12);
          auVar101 = vsubps_avx(auVar85,auVar65);
          auVar67._0_4_ = auVar79._0_4_ + auVar31._0_4_;
          auVar67._4_4_ = auVar79._4_4_ + auVar31._4_4_;
          auVar67._8_4_ = auVar79._8_4_ + auVar31._8_4_;
          auVar67._12_4_ = auVar79._12_4_ + auVar31._12_4_;
          auVar87._0_4_ = auVar84._0_4_ + auVar12._0_4_;
          auVar87._4_4_ = auVar84._4_4_ + auVar12._4_4_;
          auVar87._8_4_ = auVar84._8_4_ + auVar12._8_4_;
          auVar87._12_4_ = auVar84._12_4_ + auVar12._12_4_;
          fVar30 = auVar65._0_4_;
          auVar91._0_4_ = auVar85._0_4_ + fVar30;
          fVar16 = auVar65._4_4_;
          auVar91._4_4_ = auVar85._4_4_ + fVar16;
          fVar17 = auVar65._8_4_;
          auVar91._8_4_ = auVar85._8_4_ + fVar17;
          fVar18 = auVar65._12_4_;
          auVar91._12_4_ = auVar85._12_4_ + fVar18;
          auVar125._0_4_ = auVar101._0_4_ * auVar87._0_4_;
          auVar125._4_4_ = auVar101._4_4_ * auVar87._4_4_;
          auVar125._8_4_ = auVar101._8_4_ * auVar87._8_4_;
          auVar125._12_4_ = auVar101._12_4_ * auVar87._12_4_;
          auVar73 = vfmsub231ps_fma(auVar125,auVar98,auVar91);
          auVar92._0_4_ = auVar89._0_4_ * auVar91._0_4_;
          auVar92._4_4_ = auVar89._4_4_ * auVar91._4_4_;
          auVar92._8_4_ = auVar89._8_4_ * auVar91._8_4_;
          auVar92._12_4_ = auVar89._12_4_ * auVar91._12_4_;
          auVar91 = vfmsub231ps_fma(auVar92,auVar101,auVar67);
          auVar68._0_4_ = auVar98._0_4_ * auVar67._0_4_;
          auVar68._4_4_ = auVar98._4_4_ * auVar67._4_4_;
          auVar68._8_4_ = auVar98._8_4_ * auVar67._8_4_;
          auVar68._12_4_ = auVar98._12_4_ * auVar67._12_4_;
          auVar66 = vfmsub231ps_fma(auVar68,auVar89,auVar87);
          fVar9 = *(float *)(ray + k * 4 + 0x60);
          auVar81._0_4_ = fVar9 * auVar66._0_4_;
          auVar81._4_4_ = fVar9 * auVar66._4_4_;
          auVar81._8_4_ = fVar9 * auVar66._8_4_;
          auVar81._12_4_ = fVar9 * auVar66._12_4_;
          uVar44 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar118._4_4_ = uVar44;
          auVar118._0_4_ = uVar44;
          auVar118._8_4_ = uVar44;
          auVar118._12_4_ = uVar44;
          auVar91 = vfmadd231ps_fma(auVar81,auVar118,auVar91);
          uVar44 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar127._4_4_ = uVar44;
          auVar127._0_4_ = uVar44;
          auVar127._8_4_ = uVar44;
          auVar127._12_4_ = uVar44;
          auVar68 = vfmadd231ps_fma(auVar91,auVar127,auVar73);
          auVar91 = vsubps_avx(auVar12,auVar78);
          auVar73 = vsubps_avx(auVar65,auVar64);
          auVar88._0_4_ = auVar12._0_4_ + auVar78._0_4_;
          auVar88._4_4_ = auVar12._4_4_ + auVar78._4_4_;
          auVar88._8_4_ = auVar12._8_4_ + auVar78._8_4_;
          auVar88._12_4_ = auVar12._12_4_ + auVar78._12_4_;
          auVar93._0_4_ = auVar64._0_4_ + fVar30;
          auVar93._4_4_ = auVar64._4_4_ + fVar16;
          auVar93._8_4_ = auVar64._8_4_ + fVar17;
          auVar93._12_4_ = auVar64._12_4_ + fVar18;
          fVar19 = auVar73._0_4_;
          auVar102._0_4_ = auVar88._0_4_ * fVar19;
          fVar21 = auVar73._4_4_;
          auVar102._4_4_ = auVar88._4_4_ * fVar21;
          fVar23 = auVar73._8_4_;
          auVar102._8_4_ = auVar88._8_4_ * fVar23;
          fVar25 = auVar73._12_4_;
          auVar102._12_4_ = auVar88._12_4_ * fVar25;
          auVar67 = vfmsub231ps_fma(auVar102,auVar91,auVar93);
          auVar66 = vsubps_avx(auVar31,auVar72);
          fVar128 = auVar66._0_4_;
          auVar109._0_4_ = fVar128 * auVar93._0_4_;
          fVar130 = auVar66._4_4_;
          auVar109._4_4_ = fVar130 * auVar93._4_4_;
          fVar131 = auVar66._8_4_;
          auVar109._8_4_ = fVar131 * auVar93._8_4_;
          fVar132 = auVar66._12_4_;
          auVar109._12_4_ = fVar132 * auVar93._12_4_;
          auVar94._0_4_ = auVar31._0_4_ + auVar72._0_4_;
          auVar94._4_4_ = auVar31._4_4_ + auVar72._4_4_;
          auVar94._8_4_ = auVar31._8_4_ + auVar72._8_4_;
          auVar94._12_4_ = auVar31._12_4_ + auVar72._12_4_;
          auVar65 = vfmsub231ps_fma(auVar109,auVar73,auVar94);
          fVar20 = auVar91._0_4_;
          auVar95._0_4_ = auVar94._0_4_ * fVar20;
          fVar22 = auVar91._4_4_;
          auVar95._4_4_ = auVar94._4_4_ * fVar22;
          fVar24 = auVar91._8_4_;
          auVar95._8_4_ = auVar94._8_4_ * fVar24;
          fVar26 = auVar91._12_4_;
          auVar95._12_4_ = auVar94._12_4_ * fVar26;
          auVar69 = vfmsub231ps_fma(auVar95,auVar66,auVar88);
          auVar96._0_4_ = fVar9 * auVar69._0_4_;
          auVar96._4_4_ = fVar9 * auVar69._4_4_;
          auVar96._8_4_ = fVar9 * auVar69._8_4_;
          auVar96._12_4_ = fVar9 * auVar69._12_4_;
          auVar65 = vfmadd231ps_fma(auVar96,auVar118,auVar65);
          local_908 = vfmadd231ps_fma(auVar65,auVar127,auVar67);
          auVar67 = vsubps_avx(auVar72,auVar79);
          auVar103._0_4_ = auVar79._0_4_ + auVar72._0_4_;
          auVar103._4_4_ = auVar79._4_4_ + auVar72._4_4_;
          auVar103._8_4_ = auVar79._8_4_ + auVar72._8_4_;
          auVar103._12_4_ = auVar79._12_4_ + auVar72._12_4_;
          auVar79 = vsubps_avx(auVar78,auVar84);
          auVar69._0_4_ = auVar78._0_4_ + auVar84._0_4_;
          auVar69._4_4_ = auVar78._4_4_ + auVar84._4_4_;
          auVar69._8_4_ = auVar78._8_4_ + auVar84._8_4_;
          auVar69._12_4_ = auVar78._12_4_ + auVar84._12_4_;
          auVar84 = vsubps_avx(auVar64,auVar85);
          auVar74._0_4_ = auVar64._0_4_ + auVar85._0_4_;
          auVar74._4_4_ = auVar64._4_4_ + auVar85._4_4_;
          auVar74._8_4_ = auVar64._8_4_ + auVar85._8_4_;
          auVar74._12_4_ = auVar64._12_4_ + auVar85._12_4_;
          auVar110._0_4_ = auVar69._0_4_ * auVar84._0_4_;
          auVar110._4_4_ = auVar69._4_4_ * auVar84._4_4_;
          auVar110._8_4_ = auVar69._8_4_ * auVar84._8_4_;
          auVar110._12_4_ = auVar69._12_4_ * auVar84._12_4_;
          auVar72 = vfmsub231ps_fma(auVar110,auVar79,auVar74);
          auVar75._0_4_ = auVar74._0_4_ * auVar67._0_4_;
          auVar75._4_4_ = auVar74._4_4_ * auVar67._4_4_;
          auVar75._8_4_ = auVar74._8_4_ * auVar67._8_4_;
          auVar75._12_4_ = auVar74._12_4_ * auVar67._12_4_;
          auVar65 = vfmsub231ps_fma(auVar75,auVar84,auVar103);
          auVar104._0_4_ = auVar79._0_4_ * auVar103._0_4_;
          auVar104._4_4_ = auVar79._4_4_ * auVar103._4_4_;
          auVar104._8_4_ = auVar79._8_4_ * auVar103._8_4_;
          auVar104._12_4_ = auVar79._12_4_ * auVar103._12_4_;
          auVar78 = vfmsub231ps_fma(auVar104,auVar67,auVar69);
          auVar105._0_4_ = fVar9 * auVar78._0_4_;
          auVar105._4_4_ = fVar9 * auVar78._4_4_;
          auVar105._8_4_ = fVar9 * auVar78._8_4_;
          auVar105._12_4_ = fVar9 * auVar78._12_4_;
          auVar65 = vfmadd231ps_fma(auVar105,auVar118,auVar65);
          auVar64 = vfmadd231ps_fma(auVar65,auVar127,auVar72);
          local_918 = auVar68._0_4_;
          fStack_914 = auVar68._4_4_;
          fStack_910 = auVar68._8_4_;
          fStack_90c = auVar68._12_4_;
          local_8f8._0_4_ = auVar64._0_4_ + local_918 + local_908._0_4_;
          local_8f8._4_4_ = auVar64._4_4_ + fStack_914 + local_908._4_4_;
          local_8f8._8_4_ = auVar64._8_4_ + fStack_910 + local_908._8_4_;
          local_8f8._12_4_ = auVar64._12_4_ + fStack_90c + local_908._12_4_;
          auVar129._8_4_ = 0x7fffffff;
          auVar129._0_8_ = 0x7fffffff7fffffff;
          auVar129._12_4_ = 0x7fffffff;
          auVar65 = vminps_avx(auVar68,local_908);
          auVar72 = vminps_avx(auVar65,auVar64);
          auVar65 = vandps_avx(local_8f8,auVar129);
          auVar119._0_4_ = auVar65._0_4_ * 1.1920929e-07;
          auVar119._4_4_ = auVar65._4_4_ * 1.1920929e-07;
          auVar119._8_4_ = auVar65._8_4_ * 1.1920929e-07;
          auVar119._12_4_ = auVar65._12_4_ * 1.1920929e-07;
          uVar57 = CONCAT44(auVar119._4_4_,auVar119._0_4_);
          auVar111._0_8_ = uVar57 ^ 0x8000000080000000;
          auVar111._8_4_ = -auVar119._8_4_;
          auVar111._12_4_ = -auVar119._12_4_;
          auVar72 = vcmpps_avx(auVar72,auVar111,5);
          auVar78 = vmaxps_avx(auVar68,local_908);
          auVar78 = vmaxps_avx(auVar78,auVar64);
          auVar78 = vcmpps_avx(auVar78,auVar119,2);
          auVar72 = vorps_avx(auVar72,auVar78);
          if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar72[0xf] < '\0') {
            auVar76._0_4_ = fVar20 * auVar101._0_4_;
            auVar76._4_4_ = fVar22 * auVar101._4_4_;
            auVar76._8_4_ = fVar24 * auVar101._8_4_;
            auVar76._12_4_ = fVar26 * auVar101._12_4_;
            auVar106._0_4_ = fVar128 * auVar98._0_4_;
            auVar106._4_4_ = fVar130 * auVar98._4_4_;
            auVar106._8_4_ = fVar131 * auVar98._8_4_;
            auVar106._12_4_ = fVar132 * auVar98._12_4_;
            auVar85 = vfmsub213ps_fma(auVar98,auVar73,auVar76);
            auVar112._0_4_ = auVar79._0_4_ * fVar19;
            auVar112._4_4_ = auVar79._4_4_ * fVar21;
            auVar112._8_4_ = auVar79._8_4_ * fVar23;
            auVar112._12_4_ = auVar79._12_4_ * fVar25;
            auVar120._0_4_ = fVar128 * auVar84._0_4_;
            auVar120._4_4_ = fVar130 * auVar84._4_4_;
            auVar120._8_4_ = fVar131 * auVar84._8_4_;
            auVar120._12_4_ = fVar132 * auVar84._12_4_;
            auVar84 = vfmsub213ps_fma(auVar84,auVar91,auVar112);
            auVar78 = vandps_avx(auVar129,auVar76);
            auVar64 = vandps_avx(auVar129,auVar112);
            auVar78 = vcmpps_avx(auVar78,auVar64,1);
            local_898 = vblendvps_avx(auVar84,auVar85,auVar78);
            auVar98._0_4_ = fVar20 * auVar67._0_4_;
            auVar98._4_4_ = fVar22 * auVar67._4_4_;
            auVar98._8_4_ = fVar24 * auVar67._8_4_;
            auVar98._12_4_ = fVar26 * auVar67._12_4_;
            auVar84 = vfmsub213ps_fma(auVar67,auVar73,auVar120);
            auVar113._0_4_ = auVar89._0_4_ * fVar19;
            auVar113._4_4_ = auVar89._4_4_ * fVar21;
            auVar113._8_4_ = auVar89._8_4_ * fVar23;
            auVar113._12_4_ = auVar89._12_4_ * fVar25;
            auVar85 = vfmsub213ps_fma(auVar101,auVar66,auVar113);
            auVar78 = vandps_avx(auVar129,auVar113);
            auVar64 = vandps_avx(auVar120,auVar129);
            auVar78 = vcmpps_avx(auVar78,auVar64,1);
            local_888 = vblendvps_avx(auVar84,auVar85,auVar78);
            auVar84 = vfmsub213ps_fma(auVar89,auVar91,auVar106);
            auVar79 = vfmsub213ps_fma(auVar79,auVar66,auVar98);
            auVar78 = vandps_avx(auVar129,auVar106);
            auVar64 = vandps_avx(auVar129,auVar98);
            auVar78 = vcmpps_avx(auVar78,auVar64,1);
            local_878 = vblendvps_avx(auVar79,auVar84,auVar78);
            auVar99._0_4_ = local_878._0_4_ * fVar9;
            auVar99._4_4_ = local_878._4_4_ * fVar9;
            auVar99._8_4_ = local_878._8_4_ * fVar9;
            auVar99._12_4_ = local_878._12_4_ * fVar9;
            auVar78 = vfmadd213ps_fma(auVar118,local_888,auVar99);
            auVar78 = vfmadd213ps_fma(auVar127,local_898,auVar78);
            auVar100._0_4_ = auVar78._0_4_ + auVar78._0_4_;
            auVar100._4_4_ = auVar78._4_4_ + auVar78._4_4_;
            auVar100._8_4_ = auVar78._8_4_ + auVar78._8_4_;
            auVar100._12_4_ = auVar78._12_4_ + auVar78._12_4_;
            auVar107._0_4_ = local_878._0_4_ * fVar30;
            auVar107._4_4_ = local_878._4_4_ * fVar16;
            auVar107._8_4_ = local_878._8_4_ * fVar17;
            auVar107._12_4_ = local_878._12_4_ * fVar18;
            auVar78 = vfmadd213ps_fma(auVar12,local_888,auVar107);
            auVar31 = vfmadd213ps_fma(auVar31,local_898,auVar78);
            auVar78 = vrcpps_avx(auVar100);
            auVar122._8_4_ = 0x3f800000;
            auVar122._0_8_ = &DAT_3f8000003f800000;
            auVar122._12_4_ = 0x3f800000;
            auVar12 = vfnmadd213ps_fma(auVar78,auVar100,auVar122);
            auVar78 = vfmadd132ps_fma(auVar12,auVar78,auVar78);
            local_8a8._0_4_ = auVar78._0_4_ * (auVar31._0_4_ + auVar31._0_4_);
            local_8a8._4_4_ = auVar78._4_4_ * (auVar31._4_4_ + auVar31._4_4_);
            local_8a8._8_4_ = auVar78._8_4_ * (auVar31._8_4_ + auVar31._8_4_);
            local_8a8._12_4_ = auVar78._12_4_ * (auVar31._12_4_ + auVar31._12_4_);
            uVar44 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar114._4_4_ = uVar44;
            auVar114._0_4_ = uVar44;
            auVar114._8_4_ = uVar44;
            auVar114._12_4_ = uVar44;
            auVar78 = vcmpps_avx(auVar114,local_8a8,2);
            uVar44 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar115._4_4_ = uVar44;
            auVar115._0_4_ = uVar44;
            auVar115._8_4_ = uVar44;
            auVar115._12_4_ = uVar44;
            auVar31 = vcmpps_avx(local_8a8,auVar115,2);
            auVar78 = vandps_avx(auVar31,auVar78);
            auVar31 = auVar72 & auVar78;
            if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar31[0xf] < '\0') {
              auVar72 = vandps_avx(auVar78,auVar72);
              auVar78 = vcmpps_avx(auVar100,_DAT_01feba10,4);
              auVar31 = auVar78 & auVar72;
              if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar31[0xf] < '\0') {
                local_8d8 = vandps_avx(auVar72,auVar78);
                auVar72 = vrcpps_avx(local_8f8);
                auVar82._8_4_ = 0x3f800000;
                auVar82._0_8_ = &DAT_3f8000003f800000;
                auVar82._12_4_ = 0x3f800000;
                auVar78 = vfnmadd213ps_fma(local_8f8,auVar72,auVar82);
                auVar72 = vfmadd132ps_fma(auVar78,auVar72,auVar72);
                auVar77._8_4_ = 0x219392ef;
                auVar77._0_8_ = 0x219392ef219392ef;
                auVar77._12_4_ = 0x219392ef;
                auVar65 = vcmpps_avx(auVar65,auVar77,5);
                auVar65 = vandps_avx(auVar72,auVar65);
                auVar70._0_4_ = local_918 * auVar65._0_4_;
                auVar70._4_4_ = fStack_914 * auVar65._4_4_;
                auVar70._8_4_ = fStack_910 * auVar65._8_4_;
                auVar70._12_4_ = fStack_90c * auVar65._12_4_;
                local_8c8 = vminps_avx(auVar70,auVar82);
                auVar71._0_4_ = auVar65._0_4_ * local_908._0_4_;
                auVar71._4_4_ = auVar65._4_4_ * local_908._4_4_;
                auVar71._8_4_ = auVar65._8_4_ * local_908._8_4_;
                auVar71._12_4_ = auVar65._12_4_ * local_908._12_4_;
                local_8b8 = vminps_avx(auVar71,auVar82);
                uVar45 = vmovmskps_avx(local_8d8);
                uVar57 = (ulong)uVar45;
                do {
                  uVar46 = 0;
                  for (uVar41 = uVar57; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000
                      ) {
                    uVar46 = uVar46 + 1;
                  }
                  uVar45 = *(uint *)((long)&local_928 + uVar46 * 4);
                  pGVar14 = (pSVar13->geometries).items[uVar45].ptr;
                  if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar57 = uVar57 ^ 1L << (uVar46 & 0x3f);
                    bVar62 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar62 = false;
                  }
                  else {
                    uVar44 = *(undefined4 *)(ray + k * 4 + 0x80);
                    uVar41 = (ulong)(uint)((int)uVar46 * 4);
                    uVar10 = *(undefined4 *)(local_8c8 + uVar41);
                    local_838._4_4_ = uVar10;
                    local_838._0_4_ = uVar10;
                    local_838._8_4_ = uVar10;
                    local_838._12_4_ = uVar10;
                    uVar10 = *(undefined4 *)(local_8b8 + uVar41);
                    local_828._4_4_ = uVar10;
                    local_828._0_4_ = uVar10;
                    local_828._8_4_ = uVar10;
                    local_828._12_4_ = uVar10;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar41);
                    args.context = context->user;
                    local_808._4_4_ = uVar45;
                    local_808._0_4_ = uVar45;
                    local_808._8_4_ = uVar45;
                    local_808._12_4_ = uVar45;
                    uVar10 = *(undefined4 *)((long)&local_938 + uVar41);
                    local_818._4_4_ = uVar10;
                    local_818._0_4_ = uVar10;
                    local_818._8_4_ = uVar10;
                    local_818._12_4_ = uVar10;
                    uVar10 = *(undefined4 *)(local_898 + uVar41);
                    uVar11 = *(undefined4 *)(local_888 + uVar41);
                    local_858._4_4_ = uVar11;
                    local_858._0_4_ = uVar11;
                    local_858._8_4_ = uVar11;
                    local_858._12_4_ = uVar11;
                    uVar11 = *(undefined4 *)(local_878 + uVar41);
                    local_848._4_4_ = uVar11;
                    local_848._0_4_ = uVar11;
                    local_848._8_4_ = uVar11;
                    local_848._12_4_ = uVar11;
                    local_868[0] = (RTCHitN)(char)uVar10;
                    local_868[1] = (RTCHitN)(char)((uint)uVar10 >> 8);
                    local_868[2] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                    local_868[3] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                    local_868[4] = (RTCHitN)(char)uVar10;
                    local_868[5] = (RTCHitN)(char)((uint)uVar10 >> 8);
                    local_868[6] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                    local_868[7] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                    local_868[8] = (RTCHitN)(char)uVar10;
                    local_868[9] = (RTCHitN)(char)((uint)uVar10 >> 8);
                    local_868[10] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                    local_868[0xb] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                    local_868[0xc] = (RTCHitN)(char)uVar10;
                    local_868[0xd] = (RTCHitN)(char)((uint)uVar10 >> 8);
                    local_868[0xe] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                    local_868[0xf] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                    vpcmpeqd_avx2(ZEXT1632(local_808),ZEXT1632(local_808));
                    uStack_7f4 = (args.context)->instID[0];
                    local_7f8 = uStack_7f4;
                    uStack_7f0 = uStack_7f4;
                    uStack_7ec = uStack_7f4;
                    uStack_7e8 = (args.context)->instPrimID[0];
                    uStack_7e4 = uStack_7e8;
                    uStack_7e0 = uStack_7e8;
                    uStack_7dc = uStack_7e8;
                    local_a88 = *local_a78;
                    uStack_a80 = local_a78[1];
                    args.valid = (int *)&local_a88;
                    args.geometryUserPtr = pGVar14->userPtr;
                    args.hit = local_868;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar14->occlusionFilterN)(&args);
                    }
                    auVar36._8_8_ = uStack_a80;
                    auVar36._0_8_ = local_a88;
                    if (auVar36 == (undefined1  [16])0x0) {
                      auVar65 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar65 = auVar65 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var15)(&args);
                      }
                      auVar37._8_8_ = uStack_a80;
                      auVar37._0_8_ = local_a88;
                      auVar72 = vpcmpeqd_avx((undefined1  [16])0x0,auVar37);
                      auVar65 = auVar72 ^ _DAT_01febe20;
                      auVar83._8_4_ = 0xff800000;
                      auVar83._0_8_ = 0xff800000ff800000;
                      auVar83._12_4_ = 0xff800000;
                      auVar72 = vblendvps_avx(auVar83,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar72);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar72;
                    }
                    auVar65 = vpslld_avx(auVar65,0x1f);
                    bVar34 = (auVar65 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar35 = (auVar65 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar33 = (auVar65 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar32 = -1 < auVar65[0xf];
                    bVar62 = ((bVar34 && bVar35) && bVar33) && bVar32;
                    if (((bVar34 && bVar35) && bVar33) && bVar32) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar44;
                      uVar57 = uVar57 ^ 1L << (uVar46 & 0x3f);
                    }
                  }
                  if (!bVar62) {
                    if (bVar61) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar59 = 1;
                    }
                    goto LAB_00571a2e;
                  }
                } while (uVar57 != 0);
              }
            }
          }
          local_a68 = local_a68 + 1;
          bVar61 = local_a68 < local_a70;
        } while (local_a68 != local_a70);
      }
    }
LAB_00571a2e:
  } while ((uVar59 & 3) == 0);
  return local_a60 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }